

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O1

result * __thiscall
lest::expression_lhs<nonstd::span_lite::span<int,18446744073709551615ul>const&>::operator>
          (result *__return_storage_ptr__,
          expression_lhs<nonstd::span_lite::span<int,18446744073709551615ul>const&> *this,
          span<int,_18446744073709551615UL> *rhs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  lest *this_00;
  uint *puVar3;
  ulong uVar4;
  ulong uVar5;
  size_type sVar6;
  uint *puVar7;
  uint *puVar8;
  uint *puVar9;
  span<int,_18446744073709551615UL> *in_R8;
  bool bVar10;
  int *local_d8;
  size_type local_d0;
  undefined1 local_c8 [8];
  undefined8 uStack_c0;
  string local_b8;
  span<int,_18446744073709551615UL> local_98;
  int local_88 [2];
  undefined8 uStack_80;
  char *local_78;
  size_type local_70;
  char local_68 [8];
  undefined4 uStack_60;
  undefined4 uStack_5c;
  bool local_58;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  this_00 = *(lest **)this;
  puVar3 = *(uint **)this_00;
  uVar4 = *(ulong *)(this_00 + 8);
  uVar5 = rhs->size_;
  if ((long)uVar4 < (long)rhs->size_) {
    uVar5 = uVar4;
  }
  puVar8 = puVar3;
  if ((uVar5 & 0x3fffffffffffffff) != 0) {
    puVar9 = (uint *)rhs->data_;
    puVar7 = puVar9 + uVar5;
    do {
      uVar2 = *puVar9;
      in_R8 = (span<int,_18446744073709551615UL> *)(ulong)uVar2;
      if (*puVar8 != uVar2) {
        bVar10 = (int)uVar2 < (int)*puVar8;
        goto LAB_001cf900;
      }
      puVar9 = puVar9 + 1;
      puVar8 = puVar8 + 1;
    } while (puVar9 != puVar7);
  }
  bVar10 = puVar8 != puVar3 + uVar4;
LAB_001cf900:
  local_d8 = (int *)local_c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,">","");
  local_98.data_ = local_88;
  if (local_d8 == (int *)local_c8) {
    uStack_80 = uStack_c0;
  }
  else {
    local_98.data_ = local_d8;
  }
  local_98.size_ = local_d0;
  local_d0 = 0;
  local_c8[0] = 0;
  local_d8 = (int *)local_c8;
  to_string<nonstd::span_lite::span<int,18446744073709551615ul>,nonstd::span_lite::span<int,18446744073709551615ul>>
            (&local_b8,this_00,&local_98,(string *)rhs,in_R8);
  sVar6 = local_b8._M_string_length;
  paVar1 = &local_b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p == paVar1) {
    uStack_60 = local_b8.field_2._8_4_;
    uStack_5c = local_b8.field_2._12_4_;
    local_78 = local_68;
  }
  else {
    local_78 = local_b8._M_dataplus._M_p;
  }
  local_70 = local_b8._M_string_length;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_allocated_capacity._0_4_ =
       local_b8.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  local_58 = bVar10;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_78,local_78 + sVar6);
  __return_storage_ptr__->passed = local_58;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_50,local_50 + local_48);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if (local_98.data_ != local_88) {
    operator_delete(local_98.data_);
  }
  if (local_d8 != (int *)local_c8) {
    operator_delete(local_d8);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator> ( R const & rhs ) { return result( lhs >  rhs, to_string( lhs, ">" , rhs ) ); }